

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOrder.c
# Opt level: O3

void Aig_ObjOrderInsert(Aig_Man_t *p,int ObjId)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  size_t __size;
  int iVar4;
  
  if (ObjId == 0) {
    __assert_fail("ObjId != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                  ,0x62,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
  }
  if ((ObjId < 0) || (p->vObjs->nSize <= ObjId)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if ((*(uint *)((long)p->vObjs->pArray[(uint)ObjId] + 0x18) & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode( Aig_ManObj(p, ObjId) )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                  ,99,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
  }
  iVar4 = p->nOrderAlloc;
  if (ObjId < iVar4) {
    puVar3 = p->pOrderData;
  }
  else {
    __size = (ulong)(uint)(ObjId * 4) << 2;
    if (p->pOrderData == (uint *)0x0) {
      puVar3 = (uint *)malloc(__size);
    }
    else {
      puVar3 = (uint *)realloc(p->pOrderData,__size);
      iVar4 = p->nOrderAlloc;
    }
    p->pOrderData = puVar3;
    memset(puVar3 + iVar4 * 2,0xff,(long)(ObjId * 2 - iVar4) << 3);
    p->nOrderAlloc = ObjId * 2;
  }
  uVar1 = ObjId * 2;
  if (puVar3[uVar1] == 0xffffffff) {
    if (puVar3[uVar1 | 1] != 0xffffffff) {
      __assert_fail("p->pOrderData[2*ObjId+1] == 0xFFFFFFFF",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                    ,0x6c,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
    }
    uVar2 = puVar3[(long)p->iNext * 2];
    if (puVar3[(long)(int)uVar2 * 2 + 1] == p->iNext) {
      puVar3[uVar1] = uVar2;
      puVar3[(long)(int)uVar2 * 2 + 1] = ObjId;
      puVar3[(long)p->iNext * 2] = ObjId;
      puVar3[uVar1 | 1] = p->iNext;
      p->nAndTotal = p->nAndTotal + 1;
      return;
    }
    __assert_fail("p->pOrderData[2*iPrev+1] == (unsigned)p->iNext",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                  ,0x6e,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
  }
  __assert_fail("p->pOrderData[2*ObjId] == 0xFFFFFFFF",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                ,0x6b,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
}

Assistant:

void Aig_ObjOrderInsert( Aig_Man_t * p, int ObjId )
{
    int iPrev;
    assert( ObjId != 0 );
    assert( Aig_ObjIsNode( Aig_ManObj(p, ObjId) ) );
    if ( ObjId >= p->nOrderAlloc )
    {
        int nOrderAlloc = 2 * ObjId; 
        p->pOrderData = ABC_REALLOC( unsigned, p->pOrderData, 2 * nOrderAlloc );
        memset( p->pOrderData + 2 * p->nOrderAlloc, 0xFF, sizeof(unsigned) * 2 * (nOrderAlloc - p->nOrderAlloc) );
        p->nOrderAlloc = nOrderAlloc;
    }
    assert( p->pOrderData[2*ObjId] == 0xFFFFFFFF );   // prev
    assert( p->pOrderData[2*ObjId+1] == 0xFFFFFFFF ); // next
    iPrev = p->pOrderData[2*p->iNext];
    assert( p->pOrderData[2*iPrev+1] == (unsigned)p->iNext );
    p->pOrderData[2*ObjId] = iPrev;
    p->pOrderData[2*iPrev+1] = ObjId;
    p->pOrderData[2*p->iNext] = ObjId;
    p->pOrderData[2*ObjId+1] = p->iNext;
    p->nAndTotal++;
}